

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Size XML_GetCurrentColumnNumber(XML_Parser parser)

{
  char *pcVar1;
  
  if (parser != (XML_Parser)0x0) {
    pcVar1 = parser->m_eventPtr;
    if ((pcVar1 != (char *)0x0) && (parser->m_positionPtr <= pcVar1)) {
      (*parser->m_encoding->updatePosition)
                (parser->m_encoding,parser->m_positionPtr,pcVar1,&parser->m_position);
      parser->m_positionPtr = parser->m_eventPtr;
    }
    return (parser->m_position).columnNumber;
  }
  return 0;
}

Assistant:

XML_Size XMLCALL
XML_GetCurrentColumnNumber(XML_Parser parser) {
  if (parser == NULL)
    return 0;
  if (parser->m_eventPtr && parser->m_eventPtr >= parser->m_positionPtr) {
    XmlUpdatePosition(parser->m_encoding, parser->m_positionPtr,
                      parser->m_eventPtr, &parser->m_position);
    parser->m_positionPtr = parser->m_eventPtr;
  }
  return parser->m_position.columnNumber;
}